

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O0

RealType __thiscall
OpenMD::RepulsivePower::getSuggestedCutoffRadius
          (RepulsivePower *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  RPInteractionData mixer;
  int rptid2;
  int rptid1;
  int atid2;
  int atid1;
  RepulsivePower *in_stack_000001f0;
  double local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_000001f0);
  }
  iVar1 = AtomType::getIdent(in_RSI);
  iVar2 = AtomType::getIdent(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar1);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar2);
  iVar2 = *pvVar3;
  if ((iVar1 == -1) || (iVar2 == -1)) {
    local_8 = 0.0;
  }
  else {
    this_00 = std::
              vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
              ::operator[]((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                            *)(in_RDI + 0x58),(long)iVar1);
    pvVar4 = std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::
             operator[](this_00,(long)iVar2);
    local_8 = pvVar4->sigma * 2.5;
  }
  return local_8;
}

Assistant:

RealType RepulsivePower::getSuggestedCutoffRadius(
      pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1  = atypes.first->getIdent();
    int atid2  = atypes.second->getIdent();
    int rptid1 = RPtids[atid1];
    int rptid2 = RPtids[atid2];

    if (rptid1 == -1 || rptid2 == -1)
      return 0.0;
    else {
      RPInteractionData mixer = MixingMap[rptid1][rptid2];
      return 2.5 * mixer.sigma;
    }
  }